

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonConstFuncs.cpp
# Opt level: O0

Type * __thiscall
slang::ast::builtins::RandModeFunc::checkArguments
          (RandModeFunc *this,ASTContext *context,Args *args,SourceRange range,Expression *param_5)

{
  SourceRange callRange;
  bool bVar1;
  Compilation *this_00;
  Type *pTVar2;
  Type *pTVar3;
  SystemSubroutine *in_RCX;
  Args *in_RDX;
  undefined8 in_RSI;
  ASTContext *in_RDI;
  SourceLocation in_R8;
  size_t in_stack_00000010;
  size_t in_stack_00000018;
  size_t numArgs;
  Compilation *comp;
  bitmask<slang::ast::ASTFlags> *in_stack_ffffffffffffff78;
  bitmask<slang::ast::ASTFlags> *in_stack_ffffffffffffff80;
  bitmask<slang::ast::ASTFlags> in_stack_ffffffffffffffb0;
  undefined1 isMethod;
  SourceLocation in_stack_fffffffffffffff8;
  
  isMethod = (undefined1)((ulong)in_RSI >> 0x38);
  this_00 = ASTContext::getCompilation((ASTContext *)0x797d3f);
  bitmask<slang::ast::ASTFlags>::bitmask
            ((bitmask<slang::ast::ASTFlags> *)&stack0xffffffffffffffb0,TopLevelStatement);
  bVar1 = bitmask<slang::ast::ASTFlags>::has(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  pTVar2 = (Type *)(long)(int)(uint)bVar1;
  callRange.endLoc = in_stack_fffffffffffffff8;
  callRange.startLoc = in_R8;
  pTVar3 = pTVar2;
  bVar1 = SystemSubroutine::checkArgCount
                    (in_RCX,in_RDI,(bool)isMethod,in_RDX,callRange,in_stack_00000010,
                     in_stack_00000018);
  if (bVar1) {
    if (pTVar2 != (Type *)0x0) {
      std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RDX,1);
      not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0x797e14)
      ;
      bVar1 = Type::isIntegral(pTVar3);
      if (!bVar1) {
        std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RDX,1)
        ;
        pTVar3 = SystemSubroutine::badArg
                           ((SystemSubroutine *)in_stack_ffffffffffffffb0.m_bits,(ASTContext *)in_R8
                            ,(Expression *)in_RCX);
        return pTVar3;
      }
    }
    if (pTVar2 == (Type *)0x0) {
      pTVar3 = Compilation::getIntType(this_00);
    }
    else {
      pTVar3 = Compilation::getVoidType(this_00);
    }
  }
  else {
    pTVar3 = Compilation::getErrorType(this_00);
  }
  return pTVar3;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        // The number of arguments required is 1 if called as a task
        // and 0 if called as a function.
        auto& comp = context.getCompilation();
        size_t numArgs = context.flags.has(ASTFlags::TopLevelStatement) ? 1 : 0;
        if (!checkArgCount(context, true, args, range, numArgs, numArgs))
            return comp.getErrorType();

        if (numArgs) {
            // First argument is integral.
            if (!args[1]->type->isIntegral())
                return badArg(context, *args[1]);
        }

        return numArgs ? comp.getVoidType() : comp.getIntType();
    }